

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O1

HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> * __thiscall
Qentem::
HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
::allocate(HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           *this,SizeT new_capacity)

{
  int *piVar1;
  uint uVar2;
  SizeT *__s;
  long lVar3;
  ulong uVar4;
  SizeT *pSVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = (new_capacity & 1) + new_capacity;
  uVar7 = (uint)(byte)((byte)LZCOUNT(uVar2) ^ 0x1f);
  uVar6 = 1 << (uVar7 & 0x1f);
  uVar7 = 2 << (uVar7 & 0x1f);
  if (uVar2 <= uVar6) {
    uVar7 = uVar6;
  }
  this->capacity_ = uVar7;
  __s = (SizeT *)operator_new((ulong)(uVar7 * 0x34));
  if (MemoryRecord::AddAllocation(void*)::storage == '\0') {
    HashTable<Qentem::String<char16_t>,Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>
    ::allocate();
  }
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  *MemoryRecord::AddAllocation(void*)::storage = *MemoryRecord::AddAllocation(void*)::storage + 1;
  piVar1[2] = piVar1[2] + 1;
  lVar3 = malloc_usable_size(__s);
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  uVar4 = lVar3 + *(long *)(MemoryRecord::AddAllocation(void*)::storage + 4);
  *(ulong *)(MemoryRecord::AddAllocation(void*)::storage + 4) = uVar4;
  if (*(ulong *)(piVar1 + 6) < uVar4) {
    *(ulong *)(piVar1 + 6) = uVar4;
  }
  this->hashTable_ = __s;
  uVar7 = uVar7 * 4;
  uVar4 = 0;
  if (0xf < uVar7) {
    uVar4 = (ulong)(uVar7 & 0xfffffff0);
    pSVar5 = __s + 4;
    if (__s + 4 < (SizeT *)((long)__s + uVar4)) {
      pSVar5 = (SizeT *)((long)__s + uVar4);
    }
    memset(__s,0,(~(ulong)__s + (long)pSVar5 & 0xfffffffffffffff0) + 0x10);
  }
  if ((uint)uVar4 < uVar7) {
    memset((void *)(uVar4 + (long)__s),0,(ulong)(uVar7 + ~(uint)uVar4) + 1);
  }
  return (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)(__s + this->capacity_);
}

Assistant:

HItem *allocate(SizeT new_capacity) {
        constexpr SizeT32 size     = sizeof(SizeT);
        constexpr SizeT   size_sum = SizeT{size + sizeof(HItem)};

        // Making sure 'size' is not an odd number.
        new_capacity += (new_capacity & SizeT{1});
        new_capacity = Memory::AlignSize(new_capacity);

        setCapacity(new_capacity);

        SizeT *ht = Memory::ChangePointer<SizeT>(Memory::Allocate<char>((size_sum * new_capacity)));

        setHashTable(ht);

        Memory::SetToZero(ht, (size * new_capacity));

        return Memory::ChangePointer<HItem>(ht + Capacity());
    }